

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O2

bool google::protobuf::compiler::cpp::HasMapFields(Descriptor *descriptor)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  lVar4 = -1;
  lVar3 = 0;
  do {
    lVar4 = lVar4 + 1;
    if (*(int *)(descriptor + 0x2c) <= lVar4) {
      lVar4 = -1;
      lVar3 = 0;
      do {
        lVar2 = (long)*(int *)(descriptor + 0x48);
        lVar4 = lVar4 + 1;
        if (lVar2 <= lVar4) {
          return lVar4 < lVar2;
        }
        bVar1 = HasMapFields((Descriptor *)(lVar3 + *(long *)(descriptor + 0x50)));
        lVar3 = lVar3 + 0xa8;
      } while (!bVar1);
      return lVar4 < lVar2;
    }
    bVar1 = FieldDescriptor::is_map((FieldDescriptor *)(lVar3 + *(long *)(descriptor + 0x30)));
    lVar3 = lVar3 + 0xa8;
  } while (!bVar1);
  return true;
}

Assistant:

static bool HasMapFields(const Descriptor* descriptor) {
  for (int i = 0; i < descriptor->field_count(); ++i) {
    if (descriptor->field(i)->is_map()) {
      return true;
    }
  }
  for (int i = 0; i < descriptor->nested_type_count(); ++i) {
    if (HasMapFields(descriptor->nested_type(i))) return true;
  }
  return false;
}